

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void CP_DPQueryHandler(CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  SstStream s;
  int iVar1;
  void *__ptr;
  void *pvVar2;
  
  ps_register_thread_();
  if (_perfstubs_initialized == 1) {
    pvVar2 = CP_DPQueryHandler::timer;
    if (CP_DPQueryHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                                          ,"CP_DPQueryHandler",0x98b);
      pvVar2 = (void *)ps_timer_create_(__ptr);
      CP_DPQueryHandler::timer = pvVar2;
      free(__ptr);
    }
    ps_timer_start_(pvVar2);
  }
  s = *Msg_v;
  iVar1 = CMwrite(conn,s->CPInfo->SharedCM->DPQueryResponseFormat);
  if (iVar1 != 1) {
    CP_verbose(s,PerStepVerbose,"Message failed to send to unregistered reader on writer %p\n",s);
  }
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(CP_DPQueryHandler::timer);
  }
  return;
}

Assistant:

void CP_DPQueryHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                       attr_list attrs)
{
    PERFSTUBS_REGISTER_THREAD();
    PERFSTUBS_TIMER_START_FUNC(timer);
    SstStream Stream;
    int res;
    struct _DPQueryMsg *Msg = (struct _DPQueryMsg *)Msg_v;
    struct _DPQueryResponseMsg response;
    Stream = Msg->WriterFile;
    memset(&response, 0, sizeof(response));
    response.WriterResponseCondition = Msg->WriterResponseCondition;
    response.OperativeDP = Stream->DP_Interface->DPName;
    res = CMwrite(conn, Stream->CPInfo->SharedCM->DPQueryResponseFormat, &response);
    if (res != 1)
    {
        CP_verbose(Stream, PerStepVerbose,
                   "Message failed to send to unregistered reader on writer %p\n", Stream);
    }

    PERFSTUBS_TIMER_STOP_FUNC(timer);
}